

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * __thiscall
ON_Font::Internal_DecoratedFont(ON_Font *this,bool bUnderlined,bool bStrikethrough)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  ON_Font decorated;
  ON_Font local_e0;
  
  if ((bUnderlined || bStrikethrough) &&
     ((((bUnderlined || ((this->m_font_bUnderlined & 1U) != 0)) || (bStrikethrough)) ||
      (this->m_font_bStrikethrough == true)))) {
    ON_Font(&local_e0,this);
    SetUnderlined(&local_e0,bUnderlined);
    SetStrikethrough(&local_e0,bStrikethrough);
    pOVar2 = ManagedFont(&local_e0);
    pOVar1 = this;
    if ((pOVar2 != (ON_Font *)0x0) && (pOVar1 = pOVar2, pOVar2->m_quartet_member == Unset)) {
      pOVar2->m_quartet_member = this->m_quartet_member;
    }
    this = pOVar1;
    ~ON_Font(&local_e0);
  }
  return this;
}

Assistant:

const ON_Font* ON_Font::Internal_DecoratedFont(
  bool bUnderlined,
  bool bStrikethrough
) const
{
  // Underline and strikethrough are font rendering effects and are not  designed into the font glyphs.
  if (false == bUnderlined && false == bStrikethrough)
    return this;

  if (bUnderlined ? 0 : 1 == this->IsUnderlined() ? 0 : 1 && bStrikethrough ? 0 : 1 == this->IsStrikethrough() ? 0 : 1)
    return this;

  ON_Font decorated(*this);
  decorated.SetUnderlined(bUnderlined);
  decorated.SetStrikethrough(bStrikethrough);
  const ON_Font* decorated_font = decorated.ManagedFont();
  if (nullptr != decorated_font && ON_FontFaceQuartet::Member::Unset == decorated_font->m_quartet_member)
  {
    // Decorated faces are not explicitly in quartets,
    // but when dealing with rich text, we need to know what quartet member they are decorating.
    decorated_font->m_quartet_member = this->m_quartet_member;
  }

  return (nullptr != decorated_font) ? decorated_font : this;
}